

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

void iter_set_info(lzma_index_iter *iter)

{
  lzma_vli *plVar1;
  size_t sVar2;
  lzma_vli lVar3;
  lzma_vli lVar4;
  lzma_vli lVar5;
  long lVar6;
  uint32_t uVar7;
  lzma_stream_flags *plVar8;
  long lVar9;
  ulong uVar10;
  lzma_vli *plVar11;
  lzma_vli lVar12;
  lzma_vli lVar13;
  
  plVar11 = (lzma_vli *)iter->internal[1].s;
  plVar1 = (lzma_vli *)iter->internal[2].p;
  sVar2 = iter->internal[3].s;
  if (plVar1 == (lzma_vli *)0x0) {
    if (plVar11[7] != 0) {
      __assert_fail("stream->groups.root == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x3de,"void iter_set_info(lzma_index_iter *)");
    }
    iter->internal[4].s = 2;
  }
  else if ((*(lzma_vli **)(iter->internal[0].s + 0x10) == plVar11) &&
          ((lzma_vli *)plVar11[9] == plVar1)) {
    if ((lzma_vli *)plVar11[8] == plVar1) {
      if ((lzma_vli *)plVar11[7] != plVar1) {
        __assert_fail("stream->groups.root == &group->node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3f1,"void iter_set_info(lzma_index_iter *)");
      }
      if (plVar1[2] != 0) {
        __assert_fail("group->node.parent == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3f2,"void iter_set_info(lzma_index_iter *)");
      }
      iter->internal[4].s = 2;
      iter->internal[2].p = (void *)0x0;
    }
    else {
      if ((lzma_vli *)plVar11[7] == plVar1) {
        __assert_fail("stream->groups.root != &group->node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3ea,"void iter_set_info(lzma_index_iter *)");
      }
      if (*(lzma_vli **)(plVar1[2] + 0x20) != plVar1) {
        __assert_fail("group->node.parent->right == &group->node",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.c"
                      ,0x3eb,"void iter_set_info(lzma_index_iter *)");
      }
      iter->internal[4].s = 1;
      iter->internal[2] = *(anon_union_8_3_4e90d293 *)(plVar1 + 2);
    }
  }
  else {
    iter->internal[4].p = (void *)0x0;
  }
  (iter->stream).number = (ulong)(uint)plVar11[5];
  lVar13 = plVar11[0xb];
  (iter->stream).block_count = lVar13;
  lVar3 = plVar11[1];
  (iter->stream).compressed_offset = lVar3;
  lVar4 = *plVar11;
  (iter->stream).uncompressed_offset = lVar4;
  plVar8 = (lzma_stream_flags *)0x0;
  if ((int)plVar11[0xd] != -1) {
    plVar8 = (lzma_stream_flags *)(plVar11 + 0xd);
  }
  (iter->stream).flags = plVar8;
  (iter->stream).padding = plVar11[0x14];
  lVar12 = plVar11[9];
  if (lVar12 == 0) {
    lVar13 = 0;
    uVar7 = lzma_vli_size(0);
    (iter->stream).compressed_size = ((ulong)(uVar7 + 1) + 7 & 0xfffffffffffffffc) + 0x18;
  }
  else {
    lVar5 = plVar11[0xc];
    uVar7 = lzma_vli_size(lVar13);
    lVar9 = (uVar7 + 1) + lVar5;
    if ((lVar9 + 4 < 0) ||
       (lVar6 = *(long *)(lVar12 + 0x48 + *(long *)(lVar12 + 0x38) * 0x10), lVar6 < 0))
    goto LAB_004d0e3c;
    (iter->stream).compressed_size =
         (lVar9 + 7U & 0xfffffffffffffffc) + (lVar6 + 3U & 0xfffffffffffffffc) + 0x18;
    lVar13 = *(lzma_vli *)(lVar12 + 0x40 + *(long *)(lVar12 + 0x38) * 0x10);
  }
  (iter->stream).uncompressed_size = lVar13;
  if (plVar1 != (lzma_vli *)0x0) {
    lVar13 = plVar1[5];
    (iter->block).number_in_stream = lVar13 + sVar2;
    (iter->block).number_in_file = lVar13 + sVar2 + plVar11[6];
    if (sVar2 == 0) {
      uVar10 = plVar1[1];
    }
    else {
      if ((long)plVar1[sVar2 * 2 + 7] < 0) goto LAB_004d0e3c;
      uVar10 = plVar1[sVar2 * 2 + 7] + 3 & 0xfffffffffffffffc;
    }
    (iter->block).compressed_stream_offset = uVar10;
    plVar11 = plVar1 + (sVar2 - 1) * 2 + 8;
    if (sVar2 == 0) {
      plVar11 = plVar1;
    }
    lVar13 = *plVar11;
    (iter->block).uncompressed_stream_offset = lVar13;
    (iter->block).uncompressed_size = plVar1[sVar2 * 2 + 8] - lVar13;
    lVar12 = plVar1[sVar2 * 2 + 9] - uVar10;
    (iter->block).unpadded_size = lVar12;
    if ((long)lVar12 < 0) {
LAB_004d0e3c:
      __assert_fail("vli <= LZMA_VLI_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/index.h"
                    ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
    }
    (iter->block).total_size = lVar12 + 3 & 0xfffffffffffffffc;
    (iter->block).compressed_stream_offset = uVar10 + 0xc;
    (iter->block).compressed_file_offset = uVar10 + lVar3 + 0xc;
    (iter->block).uncompressed_file_offset = lVar13 + lVar4;
  }
  return;
}

Assistant:

static void
iter_set_info(lzma_index_iter *iter)
{
	const lzma_index *i = iter->internal[ITER_INDEX].p;
	const index_stream *stream = iter->internal[ITER_STREAM].p;
	const index_group *group = iter->internal[ITER_GROUP].p;
	const size_t record = iter->internal[ITER_RECORD].s;

	// lzma_index_iter.internal must not contain a pointer to the last
	// group in the index, because that may be reallocated by
	// lzma_index_cat().
	if (group == NULL) {
		// There are no groups.
		assert(stream->groups.root == NULL);
		iter->internal[ITER_METHOD].s = ITER_METHOD_LEFTMOST;

	} else if (i->streams.rightmost != &stream->node
			|| stream->groups.rightmost != &group->node) {
		// The group is not not the last group in the index.
		iter->internal[ITER_METHOD].s = ITER_METHOD_NORMAL;

	} else if (stream->groups.leftmost != &group->node) {
		// The group isn't the only group in the Stream, thus we
		// know that it must have a parent group i.e. it's not
		// the root node.
		assert(stream->groups.root != &group->node);
		assert(group->node.parent->right == &group->node);
		iter->internal[ITER_METHOD].s = ITER_METHOD_NEXT;
		iter->internal[ITER_GROUP].p = group->node.parent;

	} else {
		// The Stream has only one group.
		assert(stream->groups.root == &group->node);
		assert(group->node.parent == NULL);
		iter->internal[ITER_METHOD].s = ITER_METHOD_LEFTMOST;
		iter->internal[ITER_GROUP].p = NULL;
	}

	// NOTE: lzma_index_iter.stream.number is lzma_vli but we use uint32_t
	// internally.
	iter->stream.number = stream->number;
	iter->stream.block_count = stream->record_count;
	iter->stream.compressed_offset = stream->node.compressed_base;
	iter->stream.uncompressed_offset = stream->node.uncompressed_base;

	// iter->stream.flags will be NULL if the Stream Flags haven't been
	// set with lzma_index_stream_flags().
	iter->stream.flags = stream->stream_flags.version == UINT32_MAX
			? NULL : &stream->stream_flags;
	iter->stream.padding = stream->stream_padding;

	if (stream->groups.rightmost == NULL) {
		// Stream has no Blocks.
		iter->stream.compressed_size = index_size(0, 0)
				+ 2 * LZMA_STREAM_HEADER_SIZE;
		iter->stream.uncompressed_size = 0;
	} else {
		const index_group *g = (const index_group *)(
				stream->groups.rightmost);

		// Stream Header + Stream Footer + Index + Blocks
		iter->stream.compressed_size = 2 * LZMA_STREAM_HEADER_SIZE
				+ index_size(stream->record_count,
					stream->index_list_size)
				+ vli_ceil4(g->records[g->last].unpadded_sum);
		iter->stream.uncompressed_size
				= g->records[g->last].uncompressed_sum;
	}

	if (group != NULL) {
		iter->block.number_in_stream = group->number_base + record;
		iter->block.number_in_file = iter->block.number_in_stream
				+ stream->block_number_base;

		iter->block.compressed_stream_offset
				= record == 0 ? group->node.compressed_base
				: vli_ceil4(group->records[
					record - 1].unpadded_sum);
		iter->block.uncompressed_stream_offset
				= record == 0 ? group->node.uncompressed_base
				: group->records[record - 1].uncompressed_sum;

		iter->block.uncompressed_size
				= group->records[record].uncompressed_sum
				- iter->block.uncompressed_stream_offset;
		iter->block.unpadded_size
				= group->records[record].unpadded_sum
				- iter->block.compressed_stream_offset;
		iter->block.total_size = vli_ceil4(iter->block.unpadded_size);

		iter->block.compressed_stream_offset
				+= LZMA_STREAM_HEADER_SIZE;

		iter->block.compressed_file_offset
				= iter->block.compressed_stream_offset
				+ iter->stream.compressed_offset;
		iter->block.uncompressed_file_offset
				= iter->block.uncompressed_stream_offset
				+ iter->stream.uncompressed_offset;
	}

	return;
}